

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O1

char * hts_parse_reg(char *s,int *beg,int *end)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  char *pcVar5;
  ushort **ppuVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  undefined8 uStack_70;
  int *local_68;
  int *local_60;
  char *local_58;
  char *tmp;
  char *local_48;
  size_t local_40;
  int local_34;
  
  *end = -1;
  *beg = -1;
  uStack_70 = 0x1113f6;
  local_40 = strlen(s);
  uVar8 = (uint)local_40;
  uVar4 = local_40 & 0xffffffff;
  uVar11 = local_40 & 0xffffffff;
  do {
    uVar4 = uVar4 - 1;
    uVar10 = uVar8;
    if ((int)uVar11 < 1) break;
    uVar10 = (int)uVar11 - 1;
    uVar11 = (ulong)uVar10;
  } while (s[uVar4 & 0xffffffff] != ':');
  local_48 = s;
  if ((int)uVar10 < (int)uVar8) {
    bVar2 = (int)(uVar10 + 1) < (int)uVar8;
    if ((int)(uVar10 + 1) < (int)uVar8) {
      pcVar5 = (char *)(long)(int)uVar8;
      lVar13 = (long)(int)uVar10 + 2;
      iVar12 = ~uVar10 + uVar8;
      iVar3 = 0;
      local_68 = end;
      local_60 = beg;
      tmp = pcVar5;
      do {
        cVar1 = s[lVar13 + -1];
        if ((long)cVar1 == 0x2d) {
          iVar3 = iVar3 + 1;
        }
        else {
          uStack_70 = 0x111477;
          local_34 = iVar3;
          ppuVar6 = __ctype_b_loc();
          pcVar5 = tmp;
          s = local_48;
          iVar3 = local_34;
          if ((cVar1 != ',') && (((*ppuVar6)[cVar1] & 0x800) == 0)) break;
        }
        bVar2 = lVar13 < (long)pcVar5;
        lVar13 = lVar13 + 1;
        iVar12 = iVar12 + -1;
      } while (iVar12 != 0);
      bVar2 = (bool)(bVar2 | 1 < iVar3);
      beg = local_60;
      end = local_68;
    }
    if (bVar2) {
      uVar10 = (uint)local_40;
    }
  }
  iVar12 = (int)local_40;
  iVar3 = iVar12 - uVar10;
  if (iVar3 != 0 && (int)uVar10 <= iVar12) {
    lVar13 = -((long)(iVar3 + 1) + 0xfU & 0xfffffffffffffff0);
    pcVar5 = (char *)((long)&local_68 + lVar13);
    local_58 = pcVar5;
    if ((int)(uVar10 + 1) < iVar12) {
      lVar7 = 1;
      iVar12 = 0;
      do {
        if (s[lVar7 + (int)uVar10] != ',') {
          lVar9 = (long)iVar12;
          iVar12 = iVar12 + 1;
          pcVar5[lVar9] = s[lVar7 + (int)uVar10];
        }
        lVar7 = lVar7 + 1;
      } while (iVar3 != (int)lVar7);
      lVar7 = (long)iVar12;
    }
    else {
      lVar7 = 0;
    }
    pcVar5[lVar7] = '\0';
    *(undefined8 *)((long)&uStack_70 + lVar13) = 0x11154a;
    lVar7 = strtol(pcVar5,&local_58,10);
    iVar12 = (int)lVar7 + -1;
    iVar3 = 0;
    if (0 < iVar12) {
      iVar3 = iVar12;
    }
    *beg = iVar3;
    if (*local_58 == '\0') {
      iVar3 = 0x7fffffff;
    }
    else {
      pcVar5 = local_58 + 1;
      *(undefined8 *)((long)&uStack_70 + lVar13) = 0x111572;
      lVar13 = strtol(pcVar5,&local_58,10);
      iVar3 = (int)lVar13;
    }
    *end = iVar3;
    s = local_48;
    if (iVar3 < *beg) {
      uVar10 = (uint)local_40;
    }
  }
  if (uVar10 == (uint)local_40) {
    *beg = 0;
    *end = 0x7fffffff;
  }
  return s + (int)uVar10;
}

Assistant:

const char *hts_parse_reg(const char *s, int *beg, int *end)
{
    int i, k, l, name_end;
    *beg = *end = -1;
    name_end = l = strlen(s);
    // determine the sequence name
    for (i = l - 1; i >= 0; --i) if (s[i] == ':') break; // look for colon from the end
    if (i >= 0) name_end = i;
    if (name_end < l) { // check if this is really the end
        int n_hyphen = 0;
        for (i = name_end + 1; i < l; ++i) {
            if (s[i] == '-') ++n_hyphen;
            else if (!isdigit(s[i]) && s[i] != ',') break;
        }
        if (i < l || n_hyphen > 1) name_end = l; // malformated region string; then take str as the name
    }
    // parse the interval
    if (name_end < l) {
        char *tmp;
        tmp = (char*)alloca(l - name_end + 1);
        for (i = name_end + 1, k = 0; i < l; ++i)
            if (s[i] != ',') tmp[k++] = s[i];
        tmp[k] = 0;
        if ((*beg = strtol(tmp, &tmp, 10) - 1) < 0) *beg = 0;
        *end = *tmp? strtol(tmp + 1, &tmp, 10) : INT_MAX;
        if (*beg > *end) name_end = l;
    }
    if (name_end == l) *beg = 0, *end = INT_MAX;
    return s + name_end;
}